

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_server_connection.c
# Opt level: O0

int8_t json_server_connection_data(void *arg,uint8_t *dataBuf,uint32_t dataLen,uint32_t *parseLen)

{
  uint8_t *pBegin;
  uint8_t *pNext;
  uint8_t *puStack_48;
  uint32_t msgSize;
  uint8_t *pEnd;
  uint8_t *pResult;
  json_server_connection_t *self;
  uint32_t *parseLen_local;
  uint8_t *puStack_20;
  uint32_t dataLen_local;
  uint8_t *dataBuf_local;
  void *arg_local;
  
  if (arg == (void *)0x0) {
    arg_local._7_1_ = -1;
  }
  else {
    puStack_48 = dataBuf + dataLen;
    pResult = (uint8_t *)arg;
    self = (json_server_connection_t *)parseLen;
    parseLen_local._4_4_ = dataLen;
    puStack_20 = dataBuf;
    dataBuf_local = (uint8_t *)arg;
    if (parseLen == (uint32_t *)0x0) {
      __assert_fail("parseLen != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_node/src/json_server_connection.c"
                    ,0x85,
                    "int8_t json_server_connection_data(void *, const uint8_t *, uint32_t, uint32_t *)"
                   );
    }
    pNext._4_4_ = 0;
    *parseLen = 0;
    pBegin = (uint8_t *)numheader_decode32(dataBuf,puStack_48,(long)&pNext + 4);
    if ((puStack_20 < pBegin) && (pBegin + pNext._4_4_ <= puStack_48)) {
      pEnd = pBegin;
      json_server_connection_process_message
                ((json_server_connection_t *)pResult,pBegin,pBegin + pNext._4_4_);
      *(uint *)&self->msocket = ((int)pBegin + pNext._4_4_) - (int)puStack_20;
    }
    arg_local._7_1_ = '\0';
  }
  return arg_local._7_1_;
}

Assistant:

static int8_t json_server_connection_data(void *arg, const uint8_t *dataBuf, uint32_t dataLen, uint32_t *parseLen)
{
   json_server_connection_t *self = (json_server_connection_t*) arg;
   if (self != 0)
   {
      const uint8_t *pResult;
      const uint8_t *pEnd = dataBuf + dataLen;
      assert(parseLen != 0);
      uint32_t msgSize = 0u;
      *parseLen = 0;
      pResult = numheader_decode32(dataBuf, pEnd, &msgSize);
      if ( (pResult > dataBuf)  )
      {
         const uint8_t *pNext = pResult;
         if (pNext + msgSize <= pEnd)
         {
            json_server_connection_process_message(self, pNext, pNext+msgSize);
            pNext += msgSize;
            *parseLen = (uint32_t) (pNext - dataBuf);
         }
      }
      return 0;
   }
   return -1;
}